

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

CSHA512 * __thiscall CSHA512::Reset(CSHA512 *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->bytes = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    anon_unknown.dwarf_5a7c0a::sha512::Initialize(this->s);
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSHA512& CSHA512::Reset()
{
    bytes = 0;
    sha512::Initialize(s);
    return *this;
}